

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNdr.c
# Opt level: O0

void Wln_WriteNdr(Wln_Ntk_t *p,char *pFileName)

{
  void *pDesign_00;
  void *pDesign;
  char *pFileName_local;
  Wln_Ntk_t *p_local;
  
  pDesign_00 = Wln_NtkToNdr(p);
  Ndr_Write(pFileName,pDesign_00);
  Ndr_Delete(pDesign_00);
  printf("Dumped the current design into file \"%s\".\n",pFileName);
  return;
}

Assistant:

void Wln_WriteNdr( Wln_Ntk_t * p, char * pFileName )
{
    void * pDesign = Wln_NtkToNdr( p );
    Ndr_Write( pFileName, pDesign );
    Ndr_Delete( pDesign );
    printf( "Dumped the current design into file \"%s\".\n", pFileName );
}